

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

bitset_container_t * bitset_container_clone(bitset_container_t *src)

{
  int iVar1;
  bitset_container_t *pbVar2;
  uint64_t *__dest;
  
  pbVar2 = (bitset_container_t *)(*global_memory_hook.malloc)(0x10);
  if (pbVar2 != (bitset_container_t *)0x0) {
    iVar1 = croaring_hardware_support();
    __dest = (uint64_t *)
             (*global_memory_hook.aligned_malloc)(((ulong)iVar1 & 2) * 0x10 + 0x20,0x2000);
    pbVar2->words = __dest;
    if (__dest != (uint64_t *)0x0) {
      pbVar2->cardinality = src->cardinality;
      memcpy(__dest,src->words,0x2000);
      return pbVar2;
    }
    (*global_memory_hook.free)(pbVar2);
  }
  return (bitset_container_t *)0x0;
}

Assistant:

ALLOW_UNALIGNED
bitset_container_t *bitset_container_clone(const bitset_container_t *src) {
    bitset_container_t *bitset =
        (bitset_container_t *)roaring_malloc(sizeof(bitset_container_t));

    if (!bitset) {
        return NULL;
    }

    size_t align_size = 32;
#if CROARING_IS_X64
    if (croaring_hardware_support() & ROARING_SUPPORTS_AVX512) {
        // sizeof(__m512i) == 64
        align_size = 64;
    } else {
        // sizeof(__m256i) == 32
        align_size = 32;
    }
#endif
    bitset->words = (uint64_t *)roaring_aligned_malloc(
        align_size, sizeof(uint64_t) * BITSET_CONTAINER_SIZE_IN_WORDS);
    if (!bitset->words) {
        roaring_free(bitset);
        return NULL;
    }
    bitset->cardinality = src->cardinality;
    memcpy(bitset->words, src->words,
           sizeof(uint64_t) * BITSET_CONTAINER_SIZE_IN_WORDS);
    return bitset;
}